

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation.cpp
# Opt level: O1

void QAbstractAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  parameter_type *ppVar1;
  QBindingStatus *pQVar2;
  Direction *pDVar3;
  parameter_type pVar4;
  QBindableInterface *pQVar5;
  void **argv;
  long *plVar6;
  int iVar7;
  State newState;
  QAbstractAnimationPrivate *this;
  QObjectData *pQVar8;
  QUntypedPropertyData *data;
  long in_FS_OFFSET;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
switchD_003aebc0_caseD_6:
  pause((QAbstractAnimation *)_o);
  goto switchD_003aebc0_default;
  switch(_id) {
  case 0:
    iVar7 = 0;
    argv = (void **)0x0;
    goto LAB_003aec7a;
  case 1:
    stateChanged((QAbstractAnimation *)_o,*_a[1],*_a[2]);
    break;
  case 2:
    local_4c = *_a[1];
    puStack_40 = &local_4c;
    argv = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 2;
    goto LAB_003aec7a;
  case 3:
    local_4c = *_a[1];
    puStack_40 = &local_4c;
    argv = &local_48;
    local_48 = (void *)0x0;
    iVar7 = 3;
LAB_003aec7a:
    QMetaObject::activate(_o,&staticMetaObject,iVar7,argv);
    break;
  case 4:
    this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
    if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Running) {
      this->deleteWhenStopped = *_a[1] != 0;
LAB_003aeca8:
      newState = Running;
LAB_003aecad:
      QAbstractAnimationPrivate::setState(this,newState);
    }
    break;
  case 5:
    this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
    if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Running) {
      this->deleteWhenStopped = false;
      goto LAB_003aeca8;
    }
    break;
  case 6:
    goto switchD_003aebc0_caseD_6;
  case 7:
switchD_003aebc0_caseD_7:
    resume((QAbstractAnimation *)_o);
    break;
  case 8:
    if (*_a[1] != '\x01') goto switchD_003aebc0_caseD_7;
    goto switchD_003aebc0_caseD_6;
  case 9:
    this = (QAbstractAnimationPrivate *)(_o->d_ptr).d;
    if ((this->state).super_QPropertyData<QAbstractAnimation::State>.val != Stopped) {
      newState = Stopped;
      goto LAB_003aecad;
    }
    break;
  case 10:
    setCurrentTime((QAbstractAnimation *)_o,*_a[1]);
  }
switchD_003aebc0_default:
  switch(_c) {
  case ReadProperty:
switchD_003aeba4_caseD_1:
    if (5 < (uint)_id) goto LAB_003aedff;
    ppVar1 = (parameter_type *)*_a;
    switch(_id) {
    case 0:
      pQVar8 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar8[1].children.d.size;
      goto LAB_003aedd1;
    case 1:
      pQVar8 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar8[1].metaObject;
LAB_003aedd1:
      pQVar2 = (pQVar8->bindingStorage).bindingStatus;
      if ((pQVar2 != (QBindingStatus *)0x0) &&
         (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar8->bindingStorage,data);
      }
      pVar4 = *(parameter_type *)data;
      break;
    case 2:
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[1].field_0x30);
      break;
    case 3:
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].metaObject + 4));
      break;
    case 4:
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].children.d.size + 4));
      break;
    case 5:
      pVar4 = (*_o->_vptr_QObject[0xc])(_o);
    }
    *ppVar1 = pVar4;
LAB_003aedff:
    if (_c != BindableProperty) {
      if (_c != WriteProperty) goto switchD_003aeba4_caseD_3;
switchD_003aeba4_caseD_2:
      pDVar3 = (Direction *)*_a;
      if (_id == 4) {
        setDirection((QAbstractAnimation *)_o,*pDVar3);
      }
      else if (_id == 2) {
        setCurrentTime((QAbstractAnimation *)_o,*pDVar3);
      }
      else if (_id == 1) {
        QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                    *)&(_o->d_ptr).d[1].metaObject,*pDVar3);
      }
      if (_c != BindableProperty) goto switchD_003aeba4_caseD_3;
    }
    break;
  case WriteProperty:
    goto switchD_003aeba4_caseD_2;
  default:
    goto switchD_003aeba4_caseD_3;
  case IndexOfMethod:
    plVar6 = (long *)_a[1];
    if (((code *)*plVar6 == finished) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003aeba4_caseD_3;
    }
    if (((code *)*plVar6 == stateChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003aeba4_caseD_3;
    }
    if (((code *)*plVar6 == currentLoopChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_003aeba4_caseD_3;
    }
    if (((code *)*plVar6 == directionChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_003aeba4_caseD_3;
    }
    if (_c != BindableProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003aeba4_caseD_3;
        goto switchD_003aeba4_caseD_1;
      }
      goto switchD_003aeba4_caseD_2;
    }
    break;
  case BindableProperty:
    break;
  }
  switch(_id) {
  case 0:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[1].children.d.size;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<const_QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>,_void>
              ::iface;
    break;
  case 1:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[1].metaObject;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>,_void>
              ::iface;
    break;
  case 2:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[1].field_0x30;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 3:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<const_QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>,_void>
              ::iface;
    break;
  case 4:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>,_void>
              ::iface;
    break;
  default:
    goto switchD_003aeba4_caseD_3;
  }
  plVar6[1] = (long)pQVar5;
switchD_003aeba4_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractAnimation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished(); break;
        case 1: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::State>>(_a[2]))); break;
        case 2: _t->currentLoopChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->directionChanged((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::Direction>>(_a[1]))); break;
        case 4: _t->start((*reinterpret_cast< std::add_pointer_t<QAbstractAnimation::DeletionPolicy>>(_a[1]))); break;
        case 5: _t->start(); break;
        case 6: _t->pause(); break;
        case 7: _t->resume(); break;
        case 8: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 9: _t->stop(); break;
        case 10: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)()>(_a, &QAbstractAnimation::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::State , QAbstractAnimation::State )>(_a, &QAbstractAnimation::stateChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(int )>(_a, &QAbstractAnimation::currentLoopChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractAnimation::*)(QAbstractAnimation::Direction )>(_a, &QAbstractAnimation::directionChanged, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->currentLoop(); break;
        case 4: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableState(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentLoop(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        default: break;
        }
    }
}